

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O1

int map_file_contents(file_stream *strm,u64 size)

{
  int iVar1;
  void *__addr;
  int *piVar2;
  
  if (size != 0) {
    iVar1 = 0;
    __addr = mmap64((void *)0x0,size,1,1,strm->fd,0);
    strm->mmap_mem = __addr;
    if (__addr == (void *)0xffffffffffffffff) {
      strm->mmap_mem = (void *)0x0;
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (iVar1 == 0xc) {
        msg("%s is too large to be processed by this program",strm->name);
      }
      else {
        if ((iVar1 == 0x16) || (iVar1 == 0x13)) goto LAB_0010650a;
        msg_errno("Unable to map %s into memory",strm->name);
      }
      iVar1 = -1;
    }
    else {
      posix_madvise(__addr,size,2);
      strm->mmap_token = strm;
      strm->mmap_size = size;
    }
    return iVar1;
  }
LAB_0010650a:
  iVar1 = read_full_contents(strm);
  return iVar1;
}

Assistant:

int
map_file_contents(struct file_stream *strm, u64 size)
{
	if (size == 0) /* mmap isn't supported on empty files */
		return read_full_contents(strm);

	if (size > SIZE_MAX) {
		msg("%"TS" is too large to be processed by this program",
		    strm->name);
		return -1;
	}
#ifdef _WIN32
	strm->mmap_token = CreateFileMapping(
				(HANDLE)(intptr_t)_get_osfhandle(strm->fd),
				NULL, PAGE_READONLY, 0, 0, NULL);
	if (strm->mmap_token == NULL) {
		DWORD err = GetLastError();
		if (err == ERROR_BAD_EXE_FORMAT) /* mmap unsupported */
			return read_full_contents(strm);
		msg("Unable create file mapping for %"TS": Windows error %u",
		    strm->name, (unsigned int)err);
		return -1;
	}

	strm->mmap_mem = MapViewOfFile((HANDLE)strm->mmap_token,
				       FILE_MAP_READ, 0, 0, size);
	if (strm->mmap_mem == NULL) {
		msg("Unable to map %"TS" into memory: Windows error %u",
		    strm->name, (unsigned int)GetLastError());
		CloseHandle((HANDLE)strm->mmap_token);
		return -1;
	}
#else /* _WIN32 */
	strm->mmap_mem = mmap(NULL, size, PROT_READ, MAP_SHARED, strm->fd, 0);
	if (strm->mmap_mem == MAP_FAILED) {
		strm->mmap_mem = NULL;
		if (errno == ENODEV /* standard */ ||
		    errno == EINVAL /* macOS */) {
			/* mmap isn't supported on this file */
			return read_full_contents(strm);
		}
		if (errno == ENOMEM) {
			msg("%"TS" is too large to be processed by this "
			    "program", strm->name);
		} else {
			msg_errno("Unable to map %"TS" into memory",
				  strm->name);
		}
		return -1;
	}

#if defined(HAVE_POSIX_MADVISE) || \
	/* fallback detection method for direct compilation */ \
	(!defined(HAVE_CONFIG_H) && defined(POSIX_MADV_SEQUENTIAL))
	(void)posix_madvise(strm->mmap_mem, size, POSIX_MADV_SEQUENTIAL);
#endif
	strm->mmap_token = strm; /* anything that's not NULL */

#endif /* !_WIN32 */
	strm->mmap_size = size;
	return 0;
}